

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer_device_debug.cpp
# Opt level: O1

Vec3fa __thiscall
embree::renderPixelAOShader
          (embree *this,DebugShaderData *data,float x,float y,ISPCCamera *camera,RayStats *stats,
          RTCFeatureFlags feature_mask)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [12];
  int iVar6;
  uint uVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar13;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar11 [16];
  float fVar14;
  undefined1 auVar12 [16];
  float fVar15;
  float fVar17;
  float fVar18;
  undefined1 auVar16 [16];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar28 [16];
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  Vec3fa VVar35;
  Ray shadow;
  Ray ray;
  float local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  long local_138 [5];
  float fStack_110;
  undefined4 uStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined8 local_f8;
  undefined8 local_d4;
  undefined1 local_b8 [8];
  float fStack_b0;
  undefined4 uStack_ac;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  float local_88;
  undefined8 local_84;
  undefined8 local_74;
  undefined4 local_50;
  RTCFeatureFlags local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  fStack_b0 = (float)(int)((ulong)*(undefined8 *)((long)&(camera->xfm).p.field_0 + 4) >> 0x20);
  local_b8 = (undefined1  [8])*(undefined8 *)&(camera->xfm).p.field_0;
  fVar9 = (camera->xfm).l.vy.field_0.field_0.x * y + (camera->xfm).l.vx.field_0.field_0.x * x +
          (camera->xfm).l.vz.field_0.field_0.x;
  auVar21._0_8_ = *(undefined8 *)((long)&(camera->xfm).l.vx.field_0 + 4);
  uVar1 = *(undefined8 *)((long)&(camera->xfm).l.vy.field_0 + 4);
  uVar2 = *(undefined8 *)((long)&(camera->xfm).l.vz.field_0 + 4);
  fVar10 = y * (float)uVar1 + (float)auVar21._0_8_ * x + (float)uVar2;
  fVar13 = y * (float)((ulong)uVar1 >> 0x20) + (float)((ulong)auVar21._0_8_ >> 0x20) * x +
           (float)((ulong)uVar2 >> 0x20);
  fVar15 = fVar9 * fVar9 + fVar10 * fVar10 + fVar13 * fVar13;
  auVar21 = rsqrtss(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15));
  fVar14 = auVar21._0_4_;
  fVar15 = fVar14 * fVar14 * fVar15 * -0.5 * fVar14 + fVar14 * 1.5;
  local_a8._4_4_ = fVar15 * fVar10;
  local_a8._0_4_ = fVar9 * fVar15;
  fStack_a0 = fVar15 * fVar13;
  uStack_ac = 0;
  local_98 = 0xffffffff7f800000;
  local_74 = 0xffffffffffffffff;
  fStack_9c = data->debug;
  local_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  local_4c = feature_mask;
  rtcTraversableIntersect1(data->traversable,local_b8);
  fVar9 = 0.0;
  stats->numRays = stats->numRays + 1;
  auVar21._0_8_ = extraout_XMM1_Qa;
  if (local_74._4_4_ != -1) {
    fVar9 = (float)local_84;
    fVar10 = (float)((ulong)local_84 >> 0x20);
    fVar15 = local_88 * local_88 + fVar9 * fVar9 + fVar10 * fVar10;
    auVar21 = rsqrtss(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15));
    fVar13 = auVar21._0_4_;
    fVar27 = fVar13 * 1.5 - fVar13 * fVar13 * fVar15 * 0.5 * fVar13;
    local_88 = local_88 * fVar27;
    fVar9 = fVar27 * fVar9;
    fVar27 = fVar27 * fVar10;
    auVar34 = ZEXT816(0);
    fVar10 = local_88;
    fVar13 = fVar9;
    fVar15 = fVar27;
    fVar14 = 0.0;
    if (0.0 <= fStack_a0 * fVar27 + (float)local_a8._4_4_ * fVar9 + (float)local_a8._0_4_ * local_88
       ) {
      fVar10 = -local_88;
      fVar13 = -fVar9;
      fVar15 = -fVar27;
      fVar14 = -0.0;
    }
    fVar29 = (float)local_a8._4_4_ * (float)local_a8._4_4_;
    fVar30 = fStack_a0 * fStack_a0;
    fVar31 = fStack_9c * fStack_9c;
    fVar32 = fVar29 + (float)local_a8._0_4_ * (float)local_a8._0_4_ + fVar30;
    fVar33 = fVar29 + fVar29 + fVar31;
    fVar30 = fVar29 + fVar30 + fVar30;
    fVar31 = fVar29 + fVar31 + fVar31;
    auVar28._4_4_ = fVar33;
    auVar28._0_4_ = fVar32;
    auVar28._8_4_ = fVar30;
    auVar28._12_4_ = fVar31;
    auVar4._4_4_ = fVar33;
    auVar4._0_4_ = fVar32;
    auVar4._8_4_ = fVar30;
    auVar4._12_4_ = fVar31;
    auVar21 = rsqrtss(auVar28,auVar4);
    fVar29 = auVar21._0_4_;
    fVar29 = fVar29 * 1.5 - fVar29 * fVar29 * fVar32 * 0.5 * fVar29;
    fVar27 = ABS(fVar27 * fVar29 * fStack_a0 +
                 fVar9 * fVar29 * (float)local_a8._4_4_ + local_88 * fVar29 * (float)local_a8._0_4_)
             * 0.8 + 0.3;
    uVar7 = (int)y << 0x10 | (int)x;
    uVar7 = uVar7 * -0x3361d2af >> 0x11 | uVar7 * 0x16a88000;
    uVar7 = (uVar7 * -0x194da000 | uVar7 * 0x1b873593 >> 0x13) * 5 + 0xe6546b64;
    uVar7 = (uVar7 * 0x2000 | uVar7 >> 0x13) * 5 + 0xe6546b64;
    uVar7 = (uVar7 >> 0x10 ^ uVar7) * -0x7a143595;
    uVar7 = (uVar7 >> 0xd ^ uVar7) * -0x3d4d51cb;
    fVar30 = -fVar13;
    fVar29 = -fVar15;
    auVar19._8_4_ = 0xffffffff;
    auVar19._0_8_ = 0xffffffffffffffff;
    if (fVar30 * fVar30 + fVar15 * fVar15 + 0.0 <= fVar10 * fVar10 + fVar29 * fVar29 + 0.0) {
      auVar19 = SUB1612((undefined1  [16])0x0,0);
    }
    fVar9 = 1.0;
    if (fVar27 <= 1.0) {
      fVar9 = fVar27;
    }
    fVar33 = (float)local_98 * (float)local_a8._0_4_ + (float)local_b8._0_4_;
    fVar17 = (float)local_98 * (float)local_a8._4_4_ + (float)local_b8._4_4_;
    fVar18 = (float)local_98 * fStack_a0 + fStack_b0;
    uVar7 = uVar7 >> 0x10 ^ uVar7;
    auVar20._0_4_ = ~auVar19._0_4_ & (uint)fVar29;
    auVar20._4_4_ = 0;
    auVar20._8_4_ = ~auVar19._8_4_ & (uint)fVar10;
    auVar5._4_4_ = (uint)fVar30 & auVar19._8_4_;
    auVar5._0_4_ = (uint)fVar15 & auVar19._4_4_;
    auVar5._8_4_ = 0;
    auVar20 = auVar20 | auVar5 << 0x20;
    fVar22 = auVar20._0_4_;
    fVar24 = auVar20._4_4_;
    fVar26 = auVar20._8_4_;
    fVar27 = fVar24 * fVar24;
    fVar29 = fVar26 * fVar26;
    fVar30 = fVar27 + fVar22 * fVar22 + fVar29;
    auVar16._0_8_ = CONCAT44(fVar27 + fVar27 + 0.0,fVar30);
    auVar16._8_4_ = fVar27 + fVar29 + fVar29;
    auVar16._12_4_ = fVar27 + 0.0 + 0.0;
    auVar11._8_4_ = auVar16._8_4_;
    auVar11._0_8_ = auVar16._0_8_;
    auVar11._12_4_ = auVar16._12_4_;
    auVar21 = rsqrtss(auVar11,auVar16);
    fVar27 = auVar21._0_4_;
    fVar31 = fVar27 * 1.5 - fVar27 * fVar27 * fVar30 * 0.5 * fVar27;
    fVar22 = fVar31 * fVar22;
    fVar24 = fVar31 * fVar24;
    fVar26 = fVar31 * fVar26;
    fVar27 = fVar24 * fVar10 - fVar13 * fVar22;
    fVar29 = fVar26 * fVar13 - fVar15 * fVar24;
    fVar30 = fVar22 * fVar15 - fVar10 * fVar26;
    fVar32 = fVar31 * 0.0 * fVar14 - fVar14 * fVar31 * 0.0;
    fVar14 = fVar29 * fVar29;
    fVar31 = fVar30 * fVar30;
    fVar32 = fVar32 * fVar32;
    fVar23 = fVar31 + fVar14 + fVar27 * fVar27;
    fVar25 = fVar32 + fVar14 + fVar14;
    fVar31 = fVar31 + fVar14 + fVar31;
    fVar32 = fVar32 + fVar14 + fVar32;
    auVar12._4_4_ = fVar25;
    auVar12._0_4_ = fVar23;
    auVar12._8_4_ = fVar31;
    auVar12._12_4_ = fVar32;
    auVar3._4_4_ = fVar25;
    auVar3._0_4_ = fVar23;
    auVar3._8_4_ = fVar31;
    auVar3._12_4_ = fVar32;
    auVar21 = rsqrtss(auVar12,auVar3);
    fVar14 = auVar21._0_4_;
    fVar14 = fVar14 * 1.5 - fVar14 * fVar14 * fVar23 * 0.5 * fVar14;
    iVar8 = 0x40;
    do {
      iVar6 = uVar7 * 0x19660d;
      uVar7 = uVar7 * 0x17385ca9 + 0x47502932;
      fVar31 = (float)(uVar7 >> 1) * 4.656613e-10;
      fVar32 = (float)(iVar6 + 0x3c6ef35fU >> 1) * 4.656613e-10 * 6.2831855;
      if (fVar31 < 0.0) {
        fVar23 = sqrtf(fVar31);
      }
      else {
        fVar23 = SQRT(fVar31);
      }
      fVar31 = 1.0 - fVar31;
      if (fVar31 < 0.0) {
        fVar31 = sqrtf(fVar31);
      }
      else {
        fVar31 = SQRT(fVar31);
      }
      fVar25 = sinf(fVar32);
      fVar32 = cosf(fVar32);
      fVar32 = fVar32 * fVar31;
      fVar25 = fVar25 * fVar31;
      local_108 = fVar32 * fVar22 + fVar23 * fVar10 + fVar25 * fVar14 * fVar29;
      fStack_104 = fVar32 * fVar24 + fVar23 * fVar13 + fVar25 * fVar14 * fVar30;
      fStack_100 = fVar32 * fVar26 + fVar23 * fVar15 + fVar25 * fVar14 * fVar27;
      local_138[4] = CONCAT44(fVar17,fVar33);
      _fStack_110 = CONCAT44(0x3a83126f,fVar18);
      local_f8 = 0xffffffff7f800000;
      local_d4 = 0xffffffffffffffff;
      fStack_fc = data->debug;
      local_138[1] = 0;
      local_138[2] = 0;
      local_138[3] = 0;
      local_138[0] = (ulong)feature_mask << 0x20;
      rtcTraversableOccluded1(data->traversable,local_138 + 4,local_138);
      stats->numRays = stats->numRays + 1;
      local_1b8 = auVar34._0_4_;
      uStack_1b4 = auVar34._4_4_;
      uStack_1b0 = auVar34._8_4_;
      uStack_1ac = auVar34._12_4_;
      auVar21._0_8_ = CONCAT44(uStack_1b4,~-(uint)((float)local_f8 < 0.0) & (uint)(local_1b8 + 1.0))
      ;
      auVar21._8_4_ = uStack_1b0;
      auVar21._12_4_ = uStack_1ac;
      auVar34 = ZEXT416((uint)local_1b8 & -(uint)((float)local_f8 < 0.0)) | auVar21;
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
    fVar9 = fVar9 * auVar34._0_4_ * 0.015625;
  }
  *(float *)this = fVar9;
  *(float *)(this + 4) = fVar9;
  *(float *)(this + 8) = fVar9;
  *(float *)(this + 0xc) = fVar9;
  VVar35.field_0.m128[1] = fVar9;
  VVar35.field_0.m128[0] = fVar9;
  VVar35.field_0._8_8_ = auVar21._0_8_;
  return (Vec3fa)VVar35.field_0;
}

Assistant:

Vec3fa renderPixelAOShader(const DebugShaderData& data, float x, float y, const ISPCCamera& camera, RayStats& stats, const RTCFeatureFlags feature_mask)
{
  /* initialize ray */
  Ray ray;
  ray.org = Vec3ff(camera.xfm.p);
  ray.dir = Vec3ff(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz));
  ray.tnear() = 0.0f;
  ray.tfar = inf;
  ray.geomID = RTC_INVALID_GEOMETRY_ID;
  ray.primID = RTC_INVALID_GEOMETRY_ID;
  ray.mask = -1;
  ray.time() = data.debug;

  /* intersect ray with scene */
  RTCIntersectArguments args;
  rtcInitIntersectArguments(&args);
  args.feature_mask = feature_mask;
  rtcTraversableIntersect1(data.traversable,RTCRayHit_(ray),&args);
  RayStats_addRay(stats);

  /* shade pixel */
  if (ray.geomID == RTC_INVALID_GEOMETRY_ID) return Vec3fa(0.0f);

  Vec3fa Ng = normalize(ray.Ng);
  Vec3fa Nf = faceforward(Ng,ray.dir,Ng);
  Vec3fa col = Vec3fa(min(1.f,.3f+.8f*abs(dot(Ng,normalize(ray.dir)))));

  /* calculate hit point */
  float intensity = 0;
  Vec3fa hitPos = ray.org + ray.tfar * ray.dir;

#define AMBIENT_OCCLUSION_SAMPLES 64
  /* trace some ambient occlusion rays */
  RandomSampler sampler;
  RandomSampler_init(sampler, (int)x, (int)y, 0);
  for (int i=0; i<AMBIENT_OCCLUSION_SAMPLES; i++)
  {
    Vec2f sample = RandomSampler_get2D(sampler);
    Sample3f dir = cosineSampleHemisphere(sample.x,sample.y,Nf);

    /* initialize shadow ray */
    Ray shadow;
    shadow.org = Vec3ff(hitPos);
    shadow.dir = Vec3ff(dir.v);
    shadow.tnear() = 0.001f;
    shadow.tfar = inf;
    shadow.geomID = RTC_INVALID_GEOMETRY_ID;
    shadow.primID = RTC_INVALID_GEOMETRY_ID;
    shadow.mask = -1;
    shadow.time() = data.debug;

    /* trace shadow ray */
    RTCOccludedArguments args;
    rtcInitOccludedArguments(&args);
    args.feature_mask = feature_mask;
    rtcTraversableOccluded1(data.traversable,RTCRay_(shadow),&args);
    RayStats_addShadowRay(stats);

    /* add light contribution */
    if (shadow.tfar >= 0.0f)
      intensity += 1.0f;
  }
  intensity *= 1.0f/AMBIENT_OCCLUSION_SAMPLES;

  /* shade pixel */
  return col * intensity;
}